

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall V1Transport::SetMessageToSend(V1Transport *this,CSerializedNetMsg *msg)

{
  Mutex *mutexIn;
  mutex_type *pmVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vchDataIn;
  CMessageHeader *in_RSI;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock39;
  CMessageHeader hdr;
  uint256 hash;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  CSerializedNetMsg *args;
  char *in_stack_ffffffffffffff48;
  CSerializedNetMsg *this_00;
  undefined8 in_stack_ffffffffffffff58;
  VectorWriter *this_01;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  mutex_type *in1;
  uint nMessageSizeIn;
  UniqueLock<AnnotatedMixin<std::mutex>_> *pUVar2;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  bool local_61;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
             (Mutex *)0xffaeef);
  mutexIn = MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                             );
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_RDI,mutexIn,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff58 >> 0x18,0));
  nMessageSizeIn = (uint)((ulong)mutexIn >> 0x20);
  if ((in_RDI[0x1a].super_unique_lock._M_owns & 1U) == 0) {
    in1 = in_RDI[0x1b].super_unique_lock._M_device;
    pmVar1 = (mutex_type *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (pmVar1 <= in1) {
      Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in1);
      this_01 = (VectorWriter *)&(in_RDI->super_unique_lock)._M_owns;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      CMessageHeader::CMessageHeader
                (in_RSI,(MessageStartChars *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),(char *)in_RDI
                 ,nMessageSizeIn);
      this_00 = (CSerializedNetMsg *)&stack0xffffffffffffffd4;
      vchDataIn = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  base_blob<256U>::begin
                            ((base_blob<256U> *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      pUVar2 = in_RDI;
      *(undefined4 *)
       &(this_00->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
           *(undefined4 *)
            &(vchDataIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
      args = (CSerializedNetMsg *)&in_RDI[0x15].super_unique_lock._M_owns;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      VectorWriter::VectorWriter<CMessageHeader&>
                (this_01,vchDataIn,(size_t)this_00,(CMessageHeader *)args);
      CSerializedNetMsg::operator=(this_00,args);
      pUVar2[0x1a].super_unique_lock._M_owns = true;
      pUVar2[0x1b].super_unique_lock._M_device = (mutex_type *)0x0;
      local_61 = true;
      goto LAB_00ffb071;
    }
  }
  local_61 = false;
LAB_00ffb071:
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_61;
  }
  __stack_chk_fail();
}

Assistant:

bool V1Transport::SetMessageToSend(CSerializedNetMsg& msg) noexcept
{
    AssertLockNotHeld(m_send_mutex);
    // Determine whether a new message can be set.
    LOCK(m_send_mutex);
    if (m_sending_header || m_bytes_sent < m_message_to_send.data.size()) return false;

    // create dbl-sha256 checksum
    uint256 hash = Hash(msg.data);

    // create header
    CMessageHeader hdr(m_magic_bytes, msg.m_type.c_str(), msg.data.size());
    memcpy(hdr.pchChecksum, hash.begin(), CMessageHeader::CHECKSUM_SIZE);

    // serialize header
    m_header_to_send.clear();
    VectorWriter{m_header_to_send, 0, hdr};

    // update state
    m_message_to_send = std::move(msg);
    m_sending_header = true;
    m_bytes_sent = 0;
    return true;
}